

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O1

REF_STATUS
ref_cavity_form_insert_tet
          (REF_CAVITY ref_cavity,REF_GRID ref_grid,REF_INT node,REF_INT site,REF_INT protect)

{
  int iVar1;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_ADJ_ITEM pRVar2;
  REF_INT *pRVar3;
  REF_INT *pRVar4;
  bool bVar5;
  uint uVar6;
  REF_STATUS RVar7;
  long lVar8;
  REF_INT item;
  long lVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  REF_BOOL all_local;
  REF_BOOL already_have_it;
  REF_INT face_nodes [3];
  uint local_60;
  int local_4c;
  int local_48;
  int local_44 [3];
  long local_38;
  
  ref_node = ref_grid->node;
  ref_cavity->ref_grid = ref_grid;
  ref_cavity->node = node;
  iVar1 = ref_node->ref_mpi->id;
  if ((iVar1 == ref_node->part[node]) && (iVar1 == ref_node->part[site])) {
    if ((ref_grid->cell[9]->n < 1) && (ref_grid->cell[10]->n < 1)) {
      ref_cell = ref_grid->cell[8];
      uVar10 = 0xffffffff;
      if (-1 < site) {
        uVar10 = 0xffffffff;
        if (site < ref_cell->ref_adj->nnode) {
          uVar10 = (ulong)(uint)ref_cell->ref_adj->first[site];
        }
      }
      if ((int)uVar10 != -1) {
        item = ref_cell->ref_adj->item[(int)uVar10].ref;
        local_60 = 0;
        do {
          if (ref_cell->node_per < 1) {
LAB_001cb501:
            uVar6 = ref_list_contains(ref_cavity->tet_list,item,&local_48);
            if (uVar6 == 0) {
              if (local_48 == 0) {
                uVar6 = ref_list_push(ref_cavity->tet_list,item);
                if (uVar6 == 0) {
                  uVar6 = ref_cell_all_local(ref_cell,ref_node,item,&local_4c);
                  if (uVar6 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                           ,0x4ed,"ref_cavity_form_insert_tet",(ulong)uVar6,"local cell");
                    local_60 = uVar6;
                  }
                  bVar5 = true;
                  if (uVar6 == 0) {
                    if (local_4c == 0) {
                      ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
                      local_60 = 0;
                    }
                    else {
                      if (0 < ref_cell->face_per) {
                        lVar8 = 0;
                        lVar11 = 0;
                        do {
                          pRVar3 = ref_cell->c2n;
                          iVar1 = ref_cell->size_per;
                          pRVar4 = ref_cell->f2n;
                          lVar9 = 0;
                          do {
                            local_44[lVar9] =
                                 pRVar3[(long)*(int *)((long)pRVar4 + lVar9 * 4 + lVar8) +
                                        (long)item * (long)iVar1];
                            lVar9 = lVar9 + 1;
                          } while (lVar9 != 3);
                          if ((((local_44[0] != node) && (local_44[1] != node)) &&
                              (local_44[2] != node)) &&
                             (local_38 = lVar8, uVar6 = ref_cavity_insert_face(ref_cavity,local_44),
                             lVar8 = local_38, uVar6 != 0)) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                   ,0x4fa,"ref_cavity_form_insert_tet",(ulong)uVar6,"tet side");
                            bVar5 = true;
                            local_60 = uVar6;
                            goto LAB_001cb5ee;
                          }
                          lVar11 = lVar11 + 1;
                          lVar8 = lVar8 + 0x10;
                        } while (lVar11 < ref_cell->face_per);
                      }
                      bVar5 = false;
                    }
                  }
                  goto LAB_001cb5ee;
                }
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x4ec,"ref_cavity_form_insert_tet",(ulong)uVar6,"save tet");
                local_60 = uVar6;
              }
              else {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x4eb,"ref_cavity_form_insert_tet","added tet twice?");
                local_60 = 1;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x4ea,"ref_cavity_form_insert_tet",(ulong)uVar6,"have tet?");
              local_60 = uVar6;
            }
            bVar5 = true;
          }
          else {
            lVar8 = 0;
            bVar12 = false;
            do {
              bVar5 = !bVar12;
              bVar12 = true;
              if (bVar5) {
                bVar12 = ref_cell->c2n[(long)ref_cell->size_per * (long)item + lVar8] == protect;
              }
              lVar8 = lVar8 + 1;
            } while (ref_cell->node_per != (int)lVar8);
            bVar5 = false;
            if (!bVar12) goto LAB_001cb501;
          }
LAB_001cb5ee:
          if (bVar5) {
            return local_60;
          }
          pRVar2 = ref_cell->ref_adj->item;
          iVar1 = pRVar2[(int)uVar10].next;
          uVar10 = (ulong)iVar1;
          if (uVar10 == 0xffffffffffffffff) {
            item = -1;
          }
          else {
            item = pRVar2[uVar10].ref;
          }
        } while (iVar1 != -1);
      }
      RVar7 = ref_cavity_verify_face_manifold(ref_cavity);
      if (RVar7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x4ff,"ref_cavity_form_insert_tet",1,"ball face manifold");
        return 1;
      }
      RVar7 = ref_cavity_verify_seg_manifold(ref_cavity);
      if (RVar7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x500,"ref_cavity_form_insert_tet",1,"ball seg manifold");
        return 1;
      }
    }
    else {
      ref_cavity->state = REF_CAVITY_MANIFOLD_CONSTRAINED;
    }
  }
  else {
    ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_form_insert_tet(REF_CAVITY ref_cavity,
                                              REF_GRID ref_grid, REF_INT node,
                                              REF_INT site, REF_INT protect) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell_face, face_node, cell;
  REF_BOOL has_node;
  REF_BOOL already_have_it, all_local;
  REF_INT face_nodes[3];

  RSS(ref_cavity_form_empty(ref_cavity, ref_grid, node), "init form empty");
  if (!ref_node_owned(ref_node, node) || !ref_node_owned(ref_node, site)) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
    return REF_SUCCESS;
  }

  /* mixed element protections are not mature */
  if (ref_cell_n(ref_grid_pyr(ref_grid)) > 0 ||
      ref_cell_n(ref_grid_pri(ref_grid)) > 0) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_MANIFOLD_CONSTRAINED;
    return REF_SUCCESS;
  }

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_cell_having_node(ref_cell, site, item, cell) {
    REF_INT cell_node;
    REF_BOOL protected_cell = REF_FALSE;
    each_ref_cell_cell_node(ref_cell, cell_node) {
      protected_cell = protected_cell ||
                       (protect == ref_cell_c2n(ref_cell, cell_node, cell));
    }
    if (protected_cell) continue;
    RSS(ref_list_contains(ref_cavity_tet_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    RAS(!already_have_it, "added tet twice?");
    RSS(ref_list_push(ref_cavity_tet_list(ref_cavity), cell), "save tet");
    RSS(ref_cell_all_local(ref_cell, ref_node, cell, &all_local), "local cell");
    if (!all_local) {
      ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
      return REF_SUCCESS;
    }
    each_ref_cell_cell_face(ref_cell, cell_face) {
      each_ref_cavity_face_node(ref_cavity, face_node) {
        face_nodes[face_node] =
            ref_cell_f2n(ref_cell, face_node, cell_face, cell);
      }
      has_node = (node == face_nodes[0] || node == face_nodes[1] ||
                  node == face_nodes[2]);
      if (!has_node) {
        RSS(ref_cavity_insert_face(ref_cavity, face_nodes), "tet side");
      }
    }
  }

  RSS(ref_cavity_verify_face_manifold(ref_cavity), "ball face manifold");
  RSS(ref_cavity_verify_seg_manifold(ref_cavity), "ball seg manifold");

  return REF_SUCCESS;
}